

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfu_cache.hpp
# Opt level: O2

void __thiscall
cappuccino::
lfu_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::do_insert(lfu_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
            *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
           basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  _List_node_base *p_Var1;
  iterator iVar2;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_List_iterator<cappuccino::lfu_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>,_false,_true>,_bool>
  pVar3;
  int local_2c;
  
  if ((this->m_open_list).
      super__List_base<cappuccino::lfu_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::lfu_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
      ._M_impl._M_node._M_size <= this->m_used_size) {
    do_prune(this);
  }
  p_Var1 = (this->m_open_list_end)._M_node;
  pVar3 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::_List_iterator<cappuccino::lfu_cache<std::__cxx11::string,std::__cxx11::string,(cappuccino::thread_safe)1>::element>>,std::allocator<std::pair<std::__cxx11::string_const,std::_List_iterator<cappuccino::lfu_cache<std::__cxx11::string,std::__cxx11::string,(cappuccino::thread_safe)1>::element>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<std::__cxx11::string_const&,std::_List_iterator<cappuccino::lfu_cache<std::__cxx11::string,std::__cxx11::string,(cappuccino::thread_safe)1>::element>&>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::_List_iterator<cappuccino::lfu_cache<std::__cxx11::string,std::__cxx11::string,(cappuccino::thread_safe)1>::element>>,std::allocator<std::pair<std::__cxx11::string_const,std::_List_iterator<cappuccino::lfu_cache<std::__cxx11::string,std::__cxx11::string,(cappuccino::thread_safe)1>::element>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&this->m_keyed_elements,key,&this->m_open_list_end);
  local_2c = 1;
  iVar2 = std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::_List_iterator<cappuccino::lfu_cache<std::__cxx11::string,std::__cxx11::string,(cappuccino::thread_safe)1>::element>>,std::_Select1st<std::pair<unsigned_long_const,std::_List_iterator<cappuccino::lfu_cache<std::__cxx11::string,std::__cxx11::string,(cappuccino::thread_safe)1>::element>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::_List_iterator<cappuccino::lfu_cache<std::__cxx11::string,std::__cxx11::string,(cappuccino::thread_safe)1>::element>>>>
          ::
          _M_emplace_equal<int,std::_List_iterator<cappuccino::lfu_cache<std::__cxx11::string,std::__cxx11::string,(cappuccino::thread_safe)1>::element>&>
                    ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::_List_iterator<cappuccino::lfu_cache<std::__cxx11::string,std::__cxx11::string,(cappuccino::thread_safe)1>::element>>,std::_Select1st<std::pair<unsigned_long_const,std::_List_iterator<cappuccino::lfu_cache<std::__cxx11::string,std::__cxx11::string,(cappuccino::thread_safe)1>::element>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::_List_iterator<cappuccino::lfu_cache<std::__cxx11::string,std::__cxx11::string,(cappuccino::thread_safe)1>::element>>>>
                      *)&this->m_lfu_list,&local_2c,&this->m_open_list_end);
  std::__cxx11::string::operator=((string *)(p_Var1 + 2),(string *)value);
  p_Var1[1]._M_next =
       (_List_node_base *)
       pVar3.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_List_iterator<cappuccino::lfu_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>,_true>
       ._M_cur.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_List_iterator<cappuccino::lfu_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>,_true>
  ;
  p_Var1[1]._M_prev = (_List_node_base *)iVar2._M_node;
  (this->m_open_list_end)._M_node = ((this->m_open_list_end)._M_node)->_M_next;
  this->m_used_size = this->m_used_size + 1;
  return;
}

Assistant:

auto do_insert(const key_type& key, value_type&& value) -> void
    {
        if (m_used_size >= m_open_list.size())
        {
            do_prune();
        }

        element& e = *m_open_list_end;

        auto keyed_position = m_keyed_elements.emplace(key, m_open_list_end).first;
        auto lfu_position   = m_lfu_list.emplace(1, m_open_list_end);

        e.m_value          = std::move(value);
        e.m_keyed_position = keyed_position;
        e.m_lfu_position   = lfu_position;

        ++m_open_list_end;

        ++m_used_size;
    }